

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.h
# Opt level: O0

bool __thiscall UnifiedRegex::Node::IsSimpleOneChar(Node *this)

{
  bool bVar1;
  bool local_11;
  Node *this_local;
  
  bVar1 = IsSimple(this);
  local_11 = false;
  if (((bVar1) && (local_11 = false, (*(uint *)&this->field_0xc >> 1 & 1) == 0)) &&
     (local_11 = false, (*(uint *)&this->field_0xc & 1) != 0)) {
    local_11 = CountDomain::IsExact(&this->thisConsumes,1);
  }
  return local_11;
}

Assistant:

inline bool IsSimpleOneChar() { return IsSimple() && !isThisIrrefutable && isFirstExact && thisConsumes.IsExact(1); }